

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

CustomLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_custom(NeuralNetworkLayer *this)

{
  bool bVar1;
  CustomLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_custom(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_custom(this);
    this_00 = (CustomLayerParams *)operator_new(0x60);
    CustomLayerParams::CustomLayerParams(this_00);
    (this->layer_).custom_ = this_00;
  }
  return (CustomLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::CustomLayerParams* NeuralNetworkLayer::mutable_custom() {
  if (!has_custom()) {
    clear_layer();
    set_has_custom();
    layer_.custom_ = new ::CoreML::Specification::CustomLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.custom)
  return layer_.custom_;
}